

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.h
# Opt level: O3

void __thiscall RigidBodyDynamics::Joint::Joint(Joint *this,SpatialVector *axis_0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  SpatialVector *axis;
  JointType JVar7;
  
  this->mDoFCount = 1;
  axis = (SpatialVector *)operator_new__(0x30);
  this->mJointAxes = axis;
  dVar1 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  dVar2 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  dVar3 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  dVar4 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  dVar5 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  (axis->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
       (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  (axis->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = dVar5;
  (axis->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = dVar3;
  (axis->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = dVar4;
  (axis->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = dVar1;
  (axis->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = dVar2;
  dVar1 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  dVar2 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  dVar3 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  dVar4 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  dVar5 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  dVar6 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  if ((((((dVar1 == 1.0) && (!NAN(dVar1))) && (dVar2 == 0.0)) && ((!NAN(dVar2) && (dVar3 == 0.0))))
      && (!NAN(dVar3))) && (((dVar4 == 0.0 && (!NAN(dVar4))) && ((dVar5 == 0.0 && (!NAN(dVar5)))))))
  {
    JVar7 = JointTypeRevoluteX;
    if ((dVar6 == 0.0) && (!NAN(dVar6))) goto LAB_0013be40;
  }
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    if ((((dVar2 == 1.0) && (!NAN(dVar2))) && (dVar3 == 0.0)) &&
       (((!NAN(dVar3) && (dVar4 == 0.0)) && ((!NAN(dVar4) && ((dVar5 == 0.0 && (!NAN(dVar5)))))))))
    {
      JVar7 = JointTypeRevoluteY;
      if ((dVar6 == 0.0) && (!NAN(dVar6))) goto LAB_0013be40;
    }
    if ((((dVar2 == 0.0) && (!NAN(dVar2))) && (dVar3 == 1.0)) &&
       (((!NAN(dVar3) && (dVar4 == 0.0)) && ((!NAN(dVar4) && ((dVar5 == 0.0 && (!NAN(dVar5)))))))))
    {
      JVar7 = JointTypeRevoluteZ;
      if ((dVar6 == 0.0) && (!NAN(dVar6))) goto LAB_0013be40;
    }
  }
  JVar7 = JointType1DoF;
LAB_0013be40:
  this->mJointType = JVar7;
  validate_spatial_axis(this,axis);
  return;
}

Assistant:

Joint (
			const Math::SpatialVector &axis_0
			) {
		mDoFCount = 1;
		mJointAxes = new Math::SpatialVector[mDoFCount];
		mJointAxes[0] = Math::SpatialVector (axis_0);
		if (axis_0 == Math::SpatialVector(1., 0., 0., 0., 0., 0.)) {
			mJointType = JointTypeRevoluteX;
		} else if (axis_0 == Math::SpatialVector(0., 1., 0., 0., 0., 0.)) {
			mJointType = JointTypeRevoluteY;
		} else if (axis_0 == Math::SpatialVector(0., 0., 1., 0., 0., 0.)) {
			mJointType = JointTypeRevoluteZ;
		} else {
			mJointType = JointType1DoF;
		}
		validate_spatial_axis (mJointAxes[0]);
	}